

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

Duration absl::lts_20250127::time_internal::FromInt64(long v)

{
  long lVar1;
  Duration DVar2;
  HiRep local_80;
  uint32_t local_78;
  HiRep local_40;
  uint32_t local_38;
  HiRep local_30;
  uint32_t local_28;
  int64_t v_local;
  uint32_t local_c;
  
  lVar1 = std::numeric_limits<long>::max();
  if ((lVar1 / 0x3c < v) || (lVar1 = std::numeric_limits<long>::min(), v < lVar1 / 0x3c)) {
    if (v < 1) {
      DVar2 = InfiniteDuration();
      DVar2 = lts_20250127::operator-(DVar2);
      local_80 = DVar2.rep_hi_;
      stack0xffffffffffffffec = local_80;
      local_78 = DVar2.rep_lo_;
      local_c = local_78;
    }
    else {
      DVar2 = InfiniteDuration();
      local_40 = DVar2.rep_hi_;
      stack0xffffffffffffffec = local_40;
      local_38 = DVar2.rep_lo_;
      local_c = local_38;
    }
  }
  else {
    DVar2 = MakeDuration(v * 0x3c,0);
    local_30 = DVar2.rep_hi_;
    stack0xffffffffffffffec = local_30;
    local_28 = DVar2.rep_lo_;
    local_c = local_28;
  }
  DVar2.rep_lo_ = local_c;
  DVar2.rep_hi_ = stack0xffffffffffffffec;
  return DVar2;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr Duration FromInt64(int64_t v,
                                                           std::ratio<60>) {
  return (v <= (std::numeric_limits<int64_t>::max)() / 60 &&
          v >= (std::numeric_limits<int64_t>::min)() / 60)
             ? MakeDuration(v * 60)
             : v > 0 ? InfiniteDuration() : -InfiniteDuration();
}